

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

bool __thiscall QTableModel::clearItemData(QTableModel *this,QModelIndex *index)

{
  QWidgetItemData *pQVar1;
  long lVar2;
  char cVar3;
  QTableWidgetItem *pQVar4;
  QWidgetItemData *pQVar5;
  bool bVar6;
  QWidgetItemData *pQVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = QAbstractItemModel::checkIndex(this,index,1);
  if ((cVar3 == '\0') || (pQVar4 = item(this,index), pQVar4 == (QTableWidgetItem *)0x0)) {
    bVar6 = false;
    goto LAB_0059268f;
  }
  pQVar5 = (pQVar4->values).d.ptr;
  lVar10 = (pQVar4->values).d.size;
  pQVar1 = pQVar5 + lVar10;
  lVar8 = lVar10 >> 2;
  if (0 < lVar8) {
    lVar9 = lVar8 + 1;
    pQVar7 = pQVar5 + 2;
    do {
      if (3 < *(ulong *)&pQVar7[-2].value.d.field_0x18) {
        pQVar7 = pQVar7 + -2;
        goto LAB_005926fc;
      }
      if (3 < *(ulong *)&pQVar7[-1].value.d.field_0x18) {
        pQVar7 = pQVar7 + -1;
        goto LAB_005926fc;
      }
      if (3 < *(ulong *)&(pQVar7->value).d.field_0x18) goto LAB_005926fc;
      if (3 < *(ulong *)&pQVar7[1].value.d.field_0x18) {
        pQVar7 = pQVar7 + 1;
        goto LAB_005926fc;
      }
      lVar9 = lVar9 + -1;
      pQVar7 = pQVar7 + 4;
    } while (1 < lVar9);
    lVar10 = (lVar10 * 0x28 + lVar8 * -0xa0 >> 3) * -0x3333333333333333;
    pQVar5 = pQVar5 + lVar8 * 4;
  }
  if (lVar10 == 1) {
LAB_005926de:
    pQVar7 = pQVar5;
    if (*(ulong *)&(pQVar5->value).d.field_0x18 < 4) {
      pQVar7 = pQVar1;
    }
  }
  else if (lVar10 == 2) {
LAB_005926d3:
    pQVar7 = pQVar5;
    if (*(ulong *)&(pQVar5->value).d.field_0x18 < 4) {
      pQVar5 = pQVar5 + 1;
      goto LAB_005926de;
    }
  }
  else {
    bVar6 = true;
    if (lVar10 != 3) goto LAB_0059268f;
    pQVar7 = pQVar5;
    if (*(ulong *)&(pQVar5->value).d.field_0x18 < 4) {
      pQVar5 = pQVar5 + 1;
      goto LAB_005926d3;
    }
  }
LAB_005926fc:
  bVar6 = true;
  if (pQVar7 != pQVar1) {
    QList<QWidgetItemData>::clear(&pQVar4->values);
    QAbstractItemModel::dataChanged((QModelIndex *)this,index,(QList_conflict *)index);
  }
LAB_0059268f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableModel::clearItemData(const QModelIndex &index)
{
    if (!checkIndex(index, CheckIndexOption::IndexIsValid))
        return false;
    QTableWidgetItem *itm = item(index);
    if (!itm)
        return false;
    const auto beginIter = itm->values.cbegin();
    const auto endIter = itm->values.cend();
    if (std::all_of(beginIter, endIter, [](const QWidgetItemData& data) -> bool { return !data.value.isValid(); }))
        return true; //it's already cleared
    itm->values.clear();
    emit dataChanged(index, index, QList<int> {});
    return true;
}